

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool __thiscall cmDependsFortran::LocateModules(cmDependsFortran *this)

{
  uint uVar1;
  cmDependsFortranInternals *pcVar2;
  cmDependsFortranInternals *this_00;
  cmMakefile *this_01;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  string *psVar6;
  pointer filename;
  bool bVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmList infoFiles;
  string fname;
  string targetDir;
  string local_258;
  ifstream fin;
  uint auStack_218 [122];
  
  pcVar2 = (this->Internal)._M_t.
           super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
           .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl;
  for (p_Var5 = *(_Base_ptr *)((long)&(pcVar2->ObjectInfo)._M_t + 0x18);
      this_00 = (this->Internal)._M_t.
                super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl,
      p_Var5 != (_Rb_tree_node_base *)((long)&(pcVar2->ObjectInfo)._M_t + 8U);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,p_Var5[3]._M_right,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&p_Var5[3]._M_parent);
    for (p_Var4 = p_Var5[5]._M_parent; p_Var4 != (_Base_ptr)&p_Var5[4]._M_right;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&((this->Internal)._M_t.
                              super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                              .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>.
                             _M_head_impl)->TargetRequires,(key_type *)(p_Var4 + 1));
      pmVar3->_M_string_length = 0;
      *(pmVar3->_M_dataplus)._M_p = '\0';
    }
  }
  if (*(size_t *)((long)&(this_00->TargetRequires)._M_t + 0x28) == 0) {
    bVar7 = true;
  }
  else {
    MatchLocalModules(this);
    this_01 = (((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
              super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetDir,"CMAKE_Fortran_TARGET_LINKED_INFO_FILES",
               (allocator<char> *)&fname);
    psVar6 = (string *)cmMakefile::GetDefinition(this_01,&targetDir);
    if (psVar6 == (string *)0x0) {
      psVar6 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::string((string *)&fin,(string *)psVar6);
    init._M_len = 1;
    init._M_array = (iterator)&fin;
    cmList::cmList(&infoFiles,init);
    std::__cxx11::string::~string((string *)&fin);
    std::__cxx11::string::~string((string *)&targetDir);
    filename = infoFiles.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar7 = filename ==
              infoFiles.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar7) break;
      cmsys::SystemTools::GetFilenamePath(&targetDir,filename);
      std::operator+(&fname,&targetDir,"/fortran.internal");
      std::ifstream::ifstream(&fin,fname._M_dataplus._M_p,_S_in);
      uVar1 = *(uint *)((long)auStack_218 + *(long *)(_fin + -0x18));
      if ((uVar1 & 5) == 0) {
        MatchRemoteModules(this,(istream *)&fin,&targetDir);
      }
      else {
        cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[24]>
                  (&local_258,(char (*) [33])"-E cmake_depends failed to open ",&fname,
                   (char (*) [24])" for module information");
        cmSystemTools::Error(&local_258);
        std::__cxx11::string::~string((string *)&local_258);
      }
      std::ifstream::~ifstream(&fin);
      std::__cxx11::string::~string((string *)&fname);
      std::__cxx11::string::~string((string *)&targetDir);
      filename = filename + 1;
    } while ((uVar1 & 5) == 0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&infoFiles.Values);
  }
  return bVar7;
}

Assistant:

bool cmDependsFortran::LocateModules()
{
  // Collect the set of modules provided and required by all sources.
  using ObjectInfoMap = cmDependsFortranInternals::ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for (auto const& infoI : objInfo) {
    cmFortranSourceInfo const& info = infoI.second;
    // Include this module in the set provided by this target.
    this->Internal->TargetProvides.insert(info.Provides.begin(),
                                          info.Provides.end());

    for (std::string const& r : info.Requires) {
      this->Internal->TargetRequires[r].clear();
    }
  }

  // Short-circuit for simple targets.
  if (this->Internal->TargetRequires.empty()) {
    return true;
  }

  // Match modules provided by this target to those it requires.
  this->MatchLocalModules();

  // Load information about other targets.
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  cmList infoFiles{ mf->GetDefinition(
    "CMAKE_Fortran_TARGET_LINKED_INFO_FILES") };
  for (auto const& i : infoFiles) {
    std::string targetDir = cmSystemTools::GetFilenamePath(i);
    std::string fname = targetDir + "/fortran.internal";
    cmsys::ifstream fin(fname.c_str());
    if (!fin) {
      cmSystemTools::Error(cmStrCat("-E cmake_depends failed to open ", fname,
                                    " for module information"));
      return false;
    }
    this->MatchRemoteModules(fin, targetDir);
  }

  // TODO: Use `CMAKE_Fortran_TARGET_FORWARD_LINKED_INFO_FILES` to handle cases
  // described in #25425. Note that because Makefiles generators do not
  // implement relaxed object compilation as described in #15555, the issues
  // never actually cause build failures; only incremental build incorrectness.

  return true;
}